

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Stats::getArrayError
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Stats *this,int index)

{
  iterator __position;
  bool bVar1;
  pointer ppBVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pSVar6;
  double dVar7;
  double dVar8;
  RealType v;
  double local_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar6 = (this->data_).
           super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppBVar2 = *(pointer *)
             &pSVar6[index].accumulatorArray2d.
              super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
              ._M_impl;
  if (*(pointer *)
       ((long)&pSVar6[index].accumulatorArray2d.
               super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
               ._M_impl + 8) != ppBVar2) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      lVar3 = __dynamic_cast(ppBVar2[uVar4],&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
      dVar8 = *(double *)(lVar3 + 0x20) - *(double *)(lVar3 + 0x18) * *(double *)(lVar3 + 0x18);
      dVar7 = 0.0;
      if (0.0 <= dVar8) {
        dVar7 = dVar8;
      }
      local_38 = (SQRT(dVar7) * 1.96) /
                 SQRT(((double)CONCAT44(0x45300000,(int)((ulong)*(undefined8 *)(lVar3 + 8) >> 0x20))
                      - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)*(undefined8 *)(lVar3 + 8)) -
                      4503599627370496.0));
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                   &local_38);
        pSVar6 = (this->data_).
                 super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        *__position._M_current = local_38;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      ppBVar2 = *(pointer *)
                 &pSVar6[index].accumulatorArray2d.
                  super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                  ._M_impl;
      bVar1 = uVar5 < (ulong)((long)*(pointer *)
                                     ((long)&pSVar6[index].accumulatorArray2d.
                                             super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                                             ._M_impl + 8) - (long)ppBVar2 >> 3);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> Stats::getArrayError(int index) {
    assert(index >= 0 && index < ENDINDEX);
    std::vector<RealType> value;
    RealType v;
    for (unsigned int i = 0; i < data_[index].accumulatorArray2d.size(); ++i) {
      dynamic_cast<Accumulator*>(data_[index].accumulatorArray2d[i])
          ->get95percentConfidenceInterval(v);
      value.push_back(v);
    }
    return value;
  }